

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameterization.cpp
# Opt level: O1

void __thiscall Parameterization::PrintPlot3D(Parameterization *this,ofstream *outfile)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  
  (**this->_vptr_Parameterization)();
  this->G = 0;
  if (0 < this->Gmax) {
    uVar5 = 0;
    do {
      (*this->_vptr_Parameterization[5])(this,uVar5);
      this->L = 0;
      cVar1 = (char)outfile;
      if (0 < this->Lmax) {
        do {
          this->K = 0;
          if (0 < this->Kmax) {
            do {
              this->J = 0;
              if (0 < this->Jmax) {
                uVar5 = 0;
                do {
                  (*this->_vptr_Parameterization[2])
                            (this,uVar5,(ulong)(uint)this->K,(ulong)(uint)this->L,
                             (ulong)(uint)this->G);
                  poVar3 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                  uVar4 = this->J + 1;
                  uVar5 = (ulong)uVar4;
                  this->J = uVar4;
                } while ((int)uVar4 < this->Jmax);
              }
              iVar2 = this->K + 1;
              this->K = iVar2;
            } while (iVar2 < this->Kmax);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          iVar2 = this->L + 1;
          this->L = iVar2;
        } while (iVar2 < this->Lmax);
      }
      this->L = 0;
      if (0 < this->Lmax) {
        do {
          this->K = 0;
          if (0 < this->Kmax) {
            do {
              this->J = 0;
              if (0 < this->Jmax) {
                uVar5 = 0;
                do {
                  (*this->_vptr_Parameterization[3])
                            (this,uVar5,(ulong)(uint)this->K,(ulong)(uint)this->L,
                             (ulong)(uint)this->G);
                  poVar3 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                  uVar4 = this->J + 1;
                  uVar5 = (ulong)uVar4;
                  this->J = uVar4;
                } while ((int)uVar4 < this->Jmax);
              }
              iVar2 = this->K + 1;
              this->K = iVar2;
            } while (iVar2 < this->Kmax);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          iVar2 = this->L + 1;
          this->L = iVar2;
        } while (iVar2 < this->Lmax);
      }
      this->L = 0;
      if (0 < this->Lmax) {
        do {
          this->K = 0;
          if (0 < this->Kmax) {
            do {
              this->J = 0;
              if (0 < this->Jmax) {
                uVar5 = 0;
                do {
                  (*this->_vptr_Parameterization[4])
                            (this,uVar5,(ulong)(uint)this->K,(ulong)(uint)this->L,
                             (ulong)(uint)this->G);
                  poVar3 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                  uVar4 = this->J + 1;
                  uVar5 = (ulong)uVar4;
                  this->J = uVar4;
                } while ((int)uVar4 < this->Jmax);
              }
              iVar2 = this->K + 1;
              this->K = iVar2;
            } while (iVar2 < this->Kmax);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          iVar2 = this->L + 1;
          this->L = iVar2;
        } while (iVar2 < this->Lmax);
      }
      uVar4 = this->G + 1;
      uVar5 = (ulong)uVar4;
      this->G = uVar4;
    } while ((int)uVar4 < this->Gmax);
  }
  return;
}

Assistant:

void Parameterization::PrintPlot3D(ofstream& outfile) {

  PrintPlot3DHeader(outfile);

  for (G = 0; G < Gmax; G++) {

    setGridIndexRanges(G);

    // All x-coordinates
    for (L = 0; L < Lmax; L++) {
    for (K = 0; K < Kmax; K++) {
    for (J = 0; J < Jmax; J++) {
      outfile << coordinateX(J, K, L, G) << " ";
    }
    }
    outfile << endl;
    }

    // All y-coordinates
    for (L = 0; L < Lmax; L++) {
    for (K = 0; K < Kmax; K++) {
    for (J = 0; J < Jmax; J++) {
      outfile << coordinateY(J, K, L, G) << " ";
    }
    }
    outfile << endl;
    }

    // All z-coordinates
    for (L = 0; L < Lmax; L++) {
    for (K = 0; K < Kmax; K++) {
    for (J = 0; J < Jmax; J++) {
      outfile << coordinateZ(J, K, L, G) << " ";
    }
    }
    outfile << endl;
    }

  }  //End: G for-loop
}